

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_long>,long,duckdb::BitOrOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar2 = *(long *)(input + 0x20);
      lVar3 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar4 = *(long *)(input + 0x28);
      if (lVar4 == 0) {
        if (count == 0) {
          return;
        }
        iVar9 = 0;
        do {
          pcVar1 = *(char **)(lVar3 + iVar9 * 8);
          uVar5 = *(ulong *)(lVar2 + iVar9 * 8);
          if (*pcVar1 == '\0') {
            *pcVar1 = '\x01';
          }
          else {
            uVar5 = uVar5 | *(ulong *)(pcVar1 + 8);
          }
          *(ulong *)(pcVar1 + 8) = uVar5;
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar6 = 0;
      uVar5 = 0;
      do {
        uVar12 = *(ulong *)(lVar4 + uVar6 * 8);
        uVar7 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar12 != 0) {
          uVar8 = uVar5;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar5 < uVar7) {
              do {
                pcVar1 = *(char **)(lVar3 + uVar5 * 8);
                uVar12 = *(ulong *)(lVar2 + uVar5 * 8);
                if (*pcVar1 == '\0') {
                  *pcVar1 = '\x01';
                }
                else {
                  uVar12 = uVar12 | *(ulong *)(pcVar1 + 8);
                }
                *(ulong *)(pcVar1 + 8) = uVar12;
                uVar5 = uVar5 + 1;
                uVar8 = uVar7;
              } while (uVar7 != uVar5);
            }
          }
          else if (uVar5 < uVar7) {
            uVar13 = 0;
            do {
              if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                pcVar1 = *(char **)(lVar3 + uVar5 * 8 + uVar13 * 8);
                uVar8 = *(ulong *)(lVar2 + uVar5 * 8 + uVar13 * 8);
                if (*pcVar1 == '\0') {
                  *(ulong *)(pcVar1 + 8) = uVar8;
                  *pcVar1 = '\x01';
                }
                else {
                  *(ulong *)(pcVar1 + 8) = *(ulong *)(pcVar1 + 8) | uVar8;
                }
              }
              uVar13 = uVar13 + 1;
              uVar8 = uVar7;
            } while (uVar7 - uVar5 != uVar13);
          }
        }
        uVar6 = uVar6 + 1;
        uVar5 = uVar8;
      } while (uVar6 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    pcVar1 = (char *)**(undefined8 **)(states + 0x20);
    uVar5 = **(ulong **)(input + 0x20);
    if (*pcVar1 == '\0') {
      *pcVar1 = '\x01';
    }
    else {
      uVar5 = uVar5 | *(ulong *)(pcVar1 + 8);
    }
    *(ulong *)(pcVar1 + 8) = uVar5;
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a8 == 0) {
    if (count != 0) {
      lVar2 = *local_b8;
      lVar3 = *local_70;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (lVar2 != 0) {
          iVar10 = (idx_t)*(uint *)(lVar2 + iVar9 * 4);
        }
        iVar11 = iVar9;
        if (lVar3 != 0) {
          iVar11 = (idx_t)*(uint *)(lVar3 + iVar9 * 4);
        }
        pcVar1 = *(char **)(local_68 + iVar11 * 8);
        uVar5 = *(ulong *)(local_b0 + iVar10 * 8);
        if (*pcVar1 == '\0') {
          *pcVar1 = '\x01';
        }
        else {
          uVar5 = uVar5 | *(ulong *)(pcVar1 + 8);
        }
        *(ulong *)(pcVar1 + 8) = uVar5;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (count != 0) {
    lVar2 = *local_b8;
    lVar3 = *local_70;
    iVar9 = 0;
    do {
      iVar10 = iVar9;
      if (lVar2 != 0) {
        iVar10 = (idx_t)*(uint *)(lVar2 + iVar9 * 4);
      }
      iVar11 = iVar9;
      if (lVar3 != 0) {
        iVar11 = (idx_t)*(uint *)(lVar3 + iVar9 * 4);
      }
      if ((*(ulong *)(local_a8 + (iVar10 >> 6) * 8) >> (iVar10 & 0x3f) & 1) != 0) {
        pcVar1 = *(char **)(local_68 + iVar11 * 8);
        uVar5 = *(ulong *)(local_b0 + iVar10 * 8);
        if (*pcVar1 == '\0') {
          *(ulong *)(pcVar1 + 8) = uVar5;
          *pcVar1 = '\x01';
        }
        else {
          *(ulong *)(pcVar1 + 8) = *(ulong *)(pcVar1 + 8) | uVar5;
        }
      }
      iVar9 = iVar9 + 1;
    } while (count != iVar9);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}